

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

FileType DirUtils::GetFileType(string *p)

{
  int iVar1;
  FileType FVar2;
  stat st;
  stat local_90;
  
  iVar1 = stat((p->_M_dataplus)._M_p,&local_90);
  FVar2 = DU_NULL;
  if (iVar1 == 0) {
    FVar2 = DU_DIRECTORY;
    if ((local_90.st_mode & 0xf000) != 0x4000) {
      FVar2 = (uint)((local_90.st_mode & 0xf000) != 0x8000) * 2;
    }
  }
  return FVar2;
}

Assistant:

DirUtils::FileType DirUtils::GetFileType(const string& p){
	struct stat st;
	int res = stat(p.c_str(), &st);
	if(res != 0){
		return DU_NULL;
	}
	if(S_ISDIR(st.st_mode) != 0)
		return DU_DIRECTORY;
	if(S_ISREG(st.st_mode) != 0)
		return DU_FILE;
	return DU_OTHER;
}